

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWaveBank_Play(FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags,
                          uint32_t dwPlayOffset,uint8_t nLoopCount,FACTWave **ppWave)

{
  uint32_t dwFlags_00;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *ppWave = (FACTWave *)0x0;
  }
  else {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    FACTWaveBank_Prepare(pWaveBank,nWaveIndex,dwFlags_00,dwPlayOffset,nLoopCount,ppWave);
    FACTWave_Play(*ppWave);
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
  }
  return (uint)(pWaveBank == (FACTWaveBank *)0x0);
}

Assistant:

uint32_t FACTWaveBank_Play(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags,
	uint32_t dwPlayOffset,
	uint8_t nLoopCount,
	FACTWave **ppWave
) {
	if (pWaveBank == NULL)
	{
		*ppWave = NULL;
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	FACTWaveBank_Prepare(
		pWaveBank,
		nWaveIndex,
		dwFlags,
		dwPlayOffset,
		nLoopCount,
		ppWave
	);
	FACTWave_Play(*ppWave);
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}